

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_TEXM3X3SPEC(Context *ctx)

{
  uint regnum;
  RegisterList *pRVar1;
  char *pcVar2;
  uint local_27c;
  char *ttypestr;
  TextureType ttype;
  RegisterList *sreg;
  char local_258 [4];
  int stage;
  char tmp2 [64];
  char tmp [64];
  char src5 [64];
  char src4 [64];
  char src3 [64];
  char src2 [64];
  char src1 [64];
  char src0 [64];
  char dst [64];
  Context *ctx_local;
  
  if (ctx->texm3x3pad_src1 != -1) {
    regnum = (ctx->dest_arg).regnum;
    allocate_ARB1_scratch_reg_name(ctx,tmp2 + 0x38,0x40);
    allocate_ARB1_scratch_reg_name(ctx,local_258,0x40);
    get_ARB1_varname_in_buf(ctx,REG_TYPE_ADDRESS,ctx->texm3x3pad_dst0,src1 + 0x38,0x40);
    get_ARB1_varname_in_buf(ctx,REG_TYPE_ADDRESS,ctx->texm3x3pad_src0,src2 + 0x38,0x40);
    get_ARB1_varname_in_buf(ctx,REG_TYPE_ADDRESS,ctx->texm3x3pad_dst1,src3 + 0x38,0x40);
    get_ARB1_varname_in_buf(ctx,REG_TYPE_ADDRESS,ctx->texm3x3pad_src1,src4 + 0x38,0x40);
    get_ARB1_varname_in_buf(ctx,REG_TYPE_ADDRESS,ctx->source_args[0].regnum,src5 + 0x38,0x40);
    get_ARB1_varname_in_buf(ctx,REG_TYPE_ADDRESS,ctx->source_args[1].regnum,tmp + 0x38,0x40);
    get_ARB1_destarg_varname(ctx,src0 + 0x38,0x40);
    pRVar1 = reglist_find(&ctx->samplers,REG_TYPE_SAMPLER,regnum);
    if (pRVar1 == (RegisterList *)0x0) {
      local_27c = 0;
    }
    else {
      local_27c = pRVar1->index;
    }
    pcVar2 = "3D";
    if (local_27c == 3) {
      pcVar2 = "CUBE";
    }
    output_line(ctx,"DP3 %s.z, %s, %s;",src0 + 0x38,src0 + 0x38,src5 + 0x38);
    output_line(ctx,"DP3 %s.x, %s, %s;",src0 + 0x38,src1 + 0x38,src2 + 0x38);
    output_line(ctx,"DP3 %s.y, %s, %s;",src0 + 0x38,src3 + 0x38,src4 + 0x38);
    output_line(ctx,"MUL %s, %s, %s;",tmp2 + 0x38,src0 + 0x38,src0 + 0x38);
    output_line(ctx,"MUL %s, %s, %s;",local_258,src0 + 0x38,tmp + 0x38);
    output_line(ctx,"RCP %s.x, %s.x;",local_258,local_258);
    output_line(ctx,"RCP %s.y, %s.y;",local_258,local_258);
    output_line(ctx,"RCP %s.z, %s.z;",local_258,local_258);
    output_line(ctx,"RCP %s.w, %s.w;",local_258,local_258);
    output_line(ctx,"MUL %s, %s, %s;",tmp2 + 0x38,tmp2 + 0x38,local_258);
    output_line(ctx,"MUL %s, %s, { 2.0, 2.0, 2.0, 2.0 };",tmp2 + 0x38,tmp2 + 0x38);
    output_line(ctx,"MAD %s, %s, %s, -%s;",tmp2 + 0x38,tmp2 + 0x38,src0 + 0x38,tmp + 0x38);
    output_line(ctx,"TEX %s, %s, texture[%d], %s;",src0 + 0x38,tmp2 + 0x38,(ulong)regnum,pcVar2);
    emit_ARB1_dest_modifiers(ctx);
  }
  return;
}

Assistant:

static void emit_ARB1_TEXM3X3SPEC(Context *ctx)
{
    if (ctx->texm3x3pad_src1 == -1)
        return;

    char dst[64];
    char src0[64];
    char src1[64];
    char src2[64];
    char src3[64];
    char src4[64];
    char src5[64];
    char tmp[64];
    char tmp2[64];

    // !!! FIXME: this code counts on the register not having swizzles, etc.
    const int stage = ctx->dest_arg.regnum;
    allocate_ARB1_scratch_reg_name(ctx, tmp, sizeof (tmp));
    allocate_ARB1_scratch_reg_name(ctx, tmp2, sizeof (tmp2));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_dst0,
                            src0, sizeof (src0));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_src0,
                            src1, sizeof (src1));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_dst1,
                            src2, sizeof (src2));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_src1,
                            src3, sizeof (src3));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->source_args[0].regnum,
                            src4, sizeof (src4));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->source_args[1].regnum,
                            src5, sizeof (src5));
    get_ARB1_destarg_varname(ctx, dst, sizeof (dst));

    RegisterList *sreg = reglist_find(&ctx->samplers, REG_TYPE_SAMPLER, stage);
    const TextureType ttype = (TextureType) (sreg ? sreg->index : 0);
    const char *ttypestr = (ttype == TEXTURE_TYPE_CUBE) ? "CUBE" : "3D";

    output_line(ctx, "DP3 %s.z, %s, %s;", dst, dst, src4);
    output_line(ctx, "DP3 %s.x, %s, %s;", dst, src0, src1);
    output_line(ctx, "DP3 %s.y, %s, %s;", dst, src2, src3);
    output_line(ctx, "MUL %s, %s, %s;", tmp, dst, dst);    // normal * normal
    output_line(ctx, "MUL %s, %s, %s;", tmp2, dst, src5);  // normal * eyeray

    // !!! FIXME: This is goofy. There's got to be a way to do vector-wide
    // !!! FIXME:  divides or reciprocals...right?
    output_line(ctx, "RCP %s.x, %s.x;", tmp2, tmp2);
    output_line(ctx, "RCP %s.y, %s.y;", tmp2, tmp2);
    output_line(ctx, "RCP %s.z, %s.z;", tmp2, tmp2);
    output_line(ctx, "RCP %s.w, %s.w;", tmp2, tmp2);
    output_line(ctx, "MUL %s, %s, %s;", tmp, tmp, tmp2);

    output_line(ctx, "MUL %s, %s, { 2.0, 2.0, 2.0, 2.0 };", tmp, tmp);
    output_line(ctx, "MAD %s, %s, %s, -%s;", tmp, tmp, dst, src5);
    output_line(ctx, "TEX %s, %s, texture[%d], %s;", dst, tmp, stage, ttypestr);
    emit_ARB1_dest_modifiers(ctx);
}